

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# customer.cpp
# Opt level: O1

void __thiscall User::User(User *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  local_58._M_string_length = (size_type)&local_58;
  local_58._M_dataplus._M_p = (pointer)&local_58;
  (this->tickets).super__List_base<Ticket,_std::allocator<Ticket>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->tickets).super__List_base<Ticket,_std::allocator<Ticket>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->tickets).super__List_base<Ticket,_std::allocator<Ticket>_>._M_impl._M_node._M_size = 0;
  (this->first_name)._M_dataplus._M_p = (pointer)&(this->first_name).field_2;
  (this->first_name)._M_string_length = 0;
  (this->first_name).field_2._M_local_buf[0] = '\0';
  (this->second_name)._M_dataplus._M_p = (pointer)&(this->second_name).field_2;
  (this->second_name)._M_string_length = 0;
  (this->second_name).field_2._M_local_buf[0] = '\0';
  (this->passport_id)._M_dataplus._M_p = (pointer)&(this->passport_id).field_2;
  (this->passport_id)._M_string_length = 0;
  (this->passport_id).field_2._M_local_buf[0] = '\0';
  local_58.field_2._M_allocated_capacity = 0;
  std::__cxx11::list<Ticket,_std::allocator<Ticket>_>::_M_move_assign(&this->tickets,&local_58);
  std::__cxx11::_List_base<Ticket,_std::allocator<Ticket>_>::_M_clear
            ((_List_base<Ticket,_std::allocator<Ticket>_> *)&local_58);
  paVar1 = &local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->first_name,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->second_name,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  this->age = 0;
  return;
}

Assistant:

User::User()
{
    tickets = std::list<Ticket>();
    first_name = std::string();
    second_name = std::string();
    string passport_id();
    age = int();
}